

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

Var Js::TaggedInt::Decrement(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  undefined1 *puVar5;
  uint lineNumber;
  
  puVar5 = (undefined1 *)((ulong)((int)aValue - 1) | (ulong)aValue & 0xffffffff00000000);
  if (puVar5 == &DAT_100007fffffff) {
    pvVar3 = DecrementUnderflowHelper((ScriptContext *)aValue);
    return pvVar3;
  }
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      error = "(Is(aValue))";
      message = "Ensure var is actually a \'TaggedInt\'";
      lineNumber = 0x43;
      goto LAB_00b0d286;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00b0d286:
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,lineNumber,error,message);
    if (!bVar2) goto LAB_00b0d2f8;
    *puVar4 = 0;
  }
  if (((ulong)aValue & 0xffffffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x26d,"(result == ToVarUnchecked( ToInt32(aValue) - 1 ))",
                                "Logic error in Int31::Decrement");
    if (!bVar2) {
LAB_00b0d2f8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return puVar5;
}

Assistant:

Var TaggedInt::Decrement(Var aValue, ScriptContext* scriptContext)
    {
#if _M_IX86

        __asm
        {
            mov     eax, aValue
            sub     eax, 2
            jno     LblDone
            push    scriptContext
            call    TaggedInt::DecrementUnderflowHelper
        LblDone:
            ; result is in eax
        }
#else

#if INT32VAR
        Var result = aValue;
        (*(unsigned int *)&result)--;  // unsigned to avoid signed int overflow
#else
        unsigned int n = reinterpret_cast<unsigned int>(aValue);
        n -= 2;
        Var result = reinterpret_cast<Var>(n);
#endif

        // Wrap-around
        if( result == MaxVal() )
        {
            // Use New instead of ToVar for this constant
            return DecrementUnderflowHelper(scriptContext);
        }

        AssertMsg( result == ToVarUnchecked( ToInt32(aValue) - 1 ), "Logic error in Int31::Decrement" );
        return result;
#endif
    }